

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

w_status wp_log_va(w_log_lvl lvl,char *file,int line,char *msg,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  wp_log_logger *logger;
  ushort local_36;
  int has_registered_logger;
  uint16_t i;
  w_status status;
  __va_list_tag *args_local;
  char *msg_local;
  int line_local;
  char *file_local;
  w_log_lvl lvl_local;
  
  if (W_LOG_LVL_ALL < lvl) {
    w_handle_failed_assertion
              ("lvl >= 0 && lvl < WP_LOG_LVL_END","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe3);
  }
  if (file == (char *)0x0) {
    w_handle_failed_assertion
              ("file != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe4);
  }
  if (msg == (char *)0x0) {
    w_handle_failed_assertion
              ("msg != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe5);
  }
  iVar2 = w_mtx_lock(&wp_log_mtx);
  if (iVar2 == 0) {
    if (wp_log_va::initialized == 0) {
      wp_log_is_std_err_console = w_is_console(_stderr);
      wp_log_va::initialized = 1;
    }
    bVar1 = false;
    for (local_36 = 0; local_36 < 8; local_36 = local_36 + 1) {
      uVar3 = (ulong)local_36;
      if ((wp_log_logger_pool[uVar3].valid != 0) && (lvl <= wp_log_logger_pool[uVar3].lvl)) {
        bVar1 = true;
        if (wp_log_logger_pool[uVar3].fmt == W_LOG_FMT_PLAIN) {
          has_registered_logger =
               wp_log_fmt_plain(wp_log_logger_pool[uVar3].stream,lvl,file,line,0,msg,args);
        }
        else if (wp_log_logger_pool[uVar3].fmt == W_LOG_FMT_PLAIN_STYLIZED) {
          has_registered_logger =
               wp_log_fmt_plain(wp_log_logger_pool[uVar3].stream,lvl,file,line,1,msg,args);
        }
        else {
          w_handle_failed_assertion
                    ("0","wp_log_va",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
                     ,0x10b);
        }
        if (has_registered_logger != 0) goto LAB_00102cad;
      }
    }
    if (!bVar1) {
      has_registered_logger =
           wp_log_fmt_plain(_stderr,lvl,file,line,wp_log_is_std_err_console,msg,args);
    }
LAB_00102cad:
    iVar2 = w_mtx_unlock(&wp_log_mtx);
    if (iVar2 != 0) {
      has_registered_logger = -0xc;
    }
    file_local._4_4_ = has_registered_logger;
  }
  else {
    file_local._4_4_ = W_ERROR_LOCK_FAILED;
  }
  return file_local._4_4_;
}

Assistant:

enum w_status
wp_log_va(
    enum w_log_lvl lvl,
    const char *file,
    int line,
    const char *msg,
    va_list args
)
{
    static int32_t initialized = 0;

    enum w_status status;
    uint16_t i;
    int has_registered_logger;

    W_ASSERT(lvl >= 0 && lvl < WP_LOG_LVL_END);
    W_ASSERT(file != NULL);
    W_ASSERT(msg != NULL);

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    if (!initialized)
    {
        wp_log_is_std_err_console = w_is_console(W_STD_ERR);
        initialized = 1;
    }

    has_registered_logger = 0;
    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        struct wp_log_logger *logger;

        logger = &wp_log_logger_pool[i];
        if (!logger->valid || (logger->lvl < lvl))
        {
            continue;
        }

        has_registered_logger = 1;
        switch (logger->fmt)
        {
            case W_LOG_FMT_PLAIN:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 0, msg, args
                );
                break;
            case W_LOG_FMT_PLAIN_STYLIZED:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 1, msg, args
                );
                break;
            default:
                W_ASSERT(0);
        }

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

    // Fallback to a default logger if none was explicitly registered.
    if (!has_registered_logger)
    {
        status = wp_log_fmt_plain(
            W_STD_ERR,
            lvl,
            file,
            line,
            wp_log_is_std_err_console,
            msg,
            args
        );

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

exit:
    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}